

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O0

void duckdb::WriteCSVChunkInternal
               (ClientContext *context,FunctionData *bind_data,DataChunk *cast_chunk,
               MemoryStream *writer,DataChunk *input,bool *written_anything,
               ExpressionExecutor *executor)

{
  bool bVar1;
  WriteCSVData *pWVar2;
  idx_t iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  const_data_ptr_t pdVar6;
  undefined8 uVar7;
  string_t *psVar8;
  Vector *in_RCX;
  DataChunk *in_RDX;
  byte *in_R9;
  string_t *str_data;
  idx_t col_idx;
  idx_t row_idx;
  CSVReaderOptions *options;
  WriteCSVData *csv_data;
  undefined7 in_stack_ffffffffffffff38;
  char in_stack_ffffffffffffff3f;
  Vector *in_stack_ffffffffffffff40;
  DataChunk *in_stack_ffffffffffffff50;
  DataChunk *local_68;
  ulong local_50;
  ulong local_48;
  
  pWVar2 = FunctionData::Cast<duckdb::WriteCSVData>((FunctionData *)in_stack_ffffffffffffff40);
  DataChunk::Reset(local_68);
  DataChunk::SetCardinality
            ((DataChunk *)in_stack_ffffffffffffff40,
             (DataChunk *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  ExpressionExecutor::Execute
            ((ExpressionExecutor *)in_stack_ffffffffffffff40,
             (DataChunk *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
             (DataChunk *)0x1485917);
  DataChunk::Flatten(in_stack_ffffffffffffff50);
  local_48 = 0;
  while( true ) {
    iVar3 = DataChunk::size(in_RDX);
    if (iVar3 <= local_48) break;
    if ((local_48 == 0) && ((*in_R9 & 1) == 0)) {
      *in_R9 = 1;
    }
    else {
      pcVar5 = (char *)::std::__cxx11::string::c_str();
      pdVar6 = const_data_ptr_cast<char>(pcVar5);
      uVar7 = ::std::__cxx11::string::size();
      (*(code *)**(undefined8 **)in_RCX)(in_RCX,pdVar6,uVar7);
    }
    local_50 = 0;
    while( true ) {
      iVar3 = DataChunk::ColumnCount((DataChunk *)0x14859f4);
      if (iVar3 <= local_50) break;
      if (local_50 != 0) {
        pbVar4 = CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::GetValue((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&(pWVar2->super_BaseCSVData).options);
        ::std::__cxx11::string::operator[]((ulong)pbVar4);
        WriteQuoteOrEscape((WriteStream *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
      }
      vector<duckdb::Vector,_true>::operator[]
                ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff40,
                 CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      bVar1 = FlatVector::IsNull(in_stack_ffffffffffffff40,
                                 CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      if (bVar1) {
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)in_stack_ffffffffffffff40,
                     CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        pcVar5 = (char *)::std::__cxx11::string::c_str();
        pdVar6 = const_data_ptr_cast<char>(pcVar5);
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)in_stack_ffffffffffffff40,
                     CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        uVar7 = ::std::__cxx11::string::size();
        (*(code *)**(undefined8 **)in_RCX)(in_RCX,pdVar6,uVar7);
      }
      else {
        vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff40,
                   CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        psVar8 = FlatVector::GetData<duckdb::string_t>((Vector *)0x1485af3);
        in_stack_ffffffffffffff40 = in_RCX;
        string_t::GetData((string_t *)in_RCX);
        string_t::GetSize(psVar8 + local_48);
        vector<bool,_true>::operator[]
                  ((vector<bool,_true> *)in_stack_ffffffffffffff40,
                   CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        ::std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&local_68);
        WriteQuotedString((WriteStream *)csv_data,(WriteCSVData *)options,(char *)row_idx,col_idx,
                          str_data._7_1_);
      }
      local_50 = local_50 + 1;
    }
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

static void WriteCSVChunkInternal(ClientContext &context, FunctionData &bind_data, DataChunk &cast_chunk,
                                  MemoryStream &writer, DataChunk &input, bool &written_anything,
                                  ExpressionExecutor &executor) {
	auto &csv_data = bind_data.Cast<WriteCSVData>();
	auto &options = csv_data.options;

	// first cast the columns of the chunk to varchar
	cast_chunk.Reset();
	cast_chunk.SetCardinality(input);

	executor.Execute(input, cast_chunk);

	cast_chunk.Flatten();
	// now loop over the vectors and output the values
	for (idx_t row_idx = 0; row_idx < cast_chunk.size(); row_idx++) {
		if (row_idx == 0 && !written_anything) {
			written_anything = true;
		} else {
			writer.WriteData(const_data_ptr_cast(csv_data.newline.c_str()), csv_data.newline.size());
		}
		// write values
		D_ASSERT(options.null_str.size() == 1);
		for (idx_t col_idx = 0; col_idx < cast_chunk.ColumnCount(); col_idx++) {
			if (col_idx != 0) {
				WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.delimiter.GetValue()[0]);
			}
			if (FlatVector::IsNull(cast_chunk.data[col_idx], row_idx)) {
				// write null value
				writer.WriteData(const_data_ptr_cast(options.null_str[0].c_str()), options.null_str[0].size());
				continue;
			}

			// non-null value, fetch the string value from the cast chunk
			auto str_data = FlatVector::GetData<string_t>(cast_chunk.data[col_idx]);
			// FIXME: we could gain some performance here by checking for certain types if they ever require quotes
			// (e.g. integers only require quotes if the delimiter is a number, decimals only require quotes if the
			// delimiter is a number or "." character)
			WriteQuotedString(writer, csv_data, str_data[row_idx].GetData(), str_data[row_idx].GetSize(),
			                  csv_data.options.force_quote[col_idx]);
		}
	}
}